

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::clear
          (vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node> *this)

{
  if (this->m_p != (vq_node *)0x0) {
    helpers::destruct_array<crnlib::clusterizer<crnlib::vec<2u,float>>::vq_node>
              (this->m_p,this->m_size);
    crnlib_free(this->m_p);
    this->m_p = (vq_node *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }